

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall
spdlog::logger::log_<fmt::v7::basic_string_view<char>,char*&>
          (logger *this,source_loc loc,level_enum lvl,basic_string_view<char> *fmt,char **args)

{
  char *s;
  size_t count;
  basic_string_view<char> *in_RDI;
  exception *ex;
  log_msg log_msg;
  memory_buf_t buf;
  bool traceback_enabled;
  bool log_enabled;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd38;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_stack_fffffffffffffd40;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *this_00;
  logger *in_stack_fffffffffffffd48;
  log_msg *log_msg_00;
  logger *in_stack_fffffffffffffd50;
  char **args_00;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_stack_fffffffffffffda0;
  level_enum in_stack_fffffffffffffdac;
  log_msg *in_stack_fffffffffffffdb0;
  string_view_t in_stack_fffffffffffffdb8;
  string_view_t in_stack_fffffffffffffdc8;
  source_loc in_stack_fffffffffffffde0;
  basic_string_view<char> local_208 [2];
  char *local_1e8;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *pbStack_1e0;
  log_msg *local_1d8;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_168;
  allocator<char> local_149;
  buffer<char> local_148 [9];
  undefined1 local_22;
  byte local_21;
  
  args_00 = (char **)&stack0x00000008;
  local_21 = should_log(in_stack_fffffffffffffd48,
                        (level_enum)((ulong)in_stack_fffffffffffffd40 >> 0x20));
  local_22 = details::backtracer::enabled((backtracer *)0x189813);
  if (((local_21 & 1) != 0) || ((bool)local_22)) {
    std::allocator<char>::allocator();
    ::fmt::v7::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::basic_memory_buffer
              (in_stack_fffffffffffffd40,(allocator<char> *)in_stack_fffffffffffffd38);
    std::allocator<char>::~allocator(&local_149);
    local_168.container =
         (buffer<char> *)
         ::fmt::v7::format_to<fmt::v7::basic_string_view<char>,char*&,250ul,char>
                   (in_stack_fffffffffffffda0,in_RDI,args_00);
    local_1d8 = (log_msg *)args_00[2];
    local_1e8 = *args_00;
    pbStack_1e0 = (basic_memory_buffer<char,_250UL,_std::allocator<char>_> *)args_00[1];
    ::fmt::v7::basic_string_view<char>::
    basic_string_view<std::char_traits<char>,std::allocator<char>>
              ((basic_string_view<char> *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    s = ::fmt::v7::detail::buffer<char>::data(local_148);
    count = ::fmt::v7::detail::buffer<char>::size(local_148);
    ::fmt::v7::basic_string_view<char>::basic_string_view(local_208,s,count);
    this_00 = pbStack_1e0;
    log_msg_00 = local_1d8;
    details::log_msg::log_msg
              (in_stack_fffffffffffffdb0,in_stack_fffffffffffffde0,in_stack_fffffffffffffdc8,
               in_stack_fffffffffffffdac,in_stack_fffffffffffffdb8);
    log_it_(in_stack_fffffffffffffd50,log_msg_00,SUB81((ulong)this_00 >> 0x38,0),
            SUB81((ulong)this_00 >> 0x30,0));
    ::fmt::v7::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::~basic_memory_buffer
              (this_00);
  }
  return;
}

Assistant:

void log_(source_loc loc, level::level_enum lvl, const FormatString &fmt, Args&&...args)
    {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled)
        {
            return;
        }
        SPDLOG_TRY
        {
            memory_buf_t buf;
            fmt::format_to(buf, fmt, std::forward<Args>(args)...);
            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            log_it_(log_msg, log_enabled, traceback_enabled);
        }